

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

void __thiscall absl::lts_20250127::Cord::RemovePrefix(Cord *this,size_t n)

{
  RefcountAndFlags *pRVar1;
  char *buffer;
  char *buffer_00;
  uint uVar2;
  byte bVar3;
  uint8_t uVar4;
  CordRep *pCVar5;
  CordRepBtree *pCVar6;
  Nonnull<char_*> pcVar7;
  ulong extraout_RAX;
  ulong uVar8;
  size_t sVar9;
  CordRepBtree *pCVar10;
  AlphaNum *in_R9;
  CordRep *old;
  CordRepBtree *this_00;
  string death_message;
  CordzUpdateScope scope;
  string local_130;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  AlphaNum local_f0;
  CordRepBtree *local_c0;
  char *local_b8;
  AlphaNum local_90;
  AlphaNum local_60;
  
  bVar3 = (this->contents_).data_.rep_.field_0.data[0];
  if (((long)(char)bVar3 & 1U) == 0) {
    uVar8 = (ulong)(long)(char)bVar3 >> 1;
  }
  else {
    uVar8 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar8 < n) {
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,"Check n <= size() failed: ","");
    local_c0 = (CordRepBtree *)0x16;
    local_b8 = "Requested prefix size ";
    buffer = local_f0.digits_;
    pcVar7 = numbers_internal::FastIntToBuffer(n,buffer);
    local_f0.piece_._M_len = (size_t)(pcVar7 + -(long)buffer);
    local_90.piece_._M_len = 0x15;
    local_90.piece_._M_str = " exceeds Cord\'s size ";
    uVar8 = (ulong)(this->contents_).data_.rep_.field_0.data[0];
    if ((uVar8 & 1) == 0) {
      sVar9 = uVar8 >> 1;
    }
    else {
      sVar9 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    buffer_00 = local_60.digits_;
    local_f0.piece_._M_str = buffer;
    pcVar7 = numbers_internal::FastIntToBuffer(sVar9,buffer_00);
    local_60.piece_._M_len = (long)pcVar7 - (long)buffer_00;
    local_60.piece_._M_str = buffer_00;
    StrCat_abi_cxx11_(&local_130,(lts_20250127 *)&local_c0,&local_f0,&local_90,&local_60,in_R9);
    std::__cxx11::string::_M_append((char *)local_110,(ulong)local_130._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
              (3,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
               ,0x2a6,local_110);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                  ,0x2a6,"void absl::Cord::RemovePrefix(size_t)");
  }
  pCVar5 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  if ((pCVar5 != (CordRep *)0x0 && (bVar3 & 1) != 0) && (pCVar5->length == 0)) {
    RemovePrefix();
  }
  pCVar6 = (CordRepBtree *)(this->contents_).data_.rep_.field_0.as_tree.rep;
  if (pCVar6 == (CordRepBtree *)0x0 || ((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    InlineRep::remove_prefix(&this->contents_,n);
    return;
  }
  local_f0.piece_._M_len = (size_t)cord_internal::InlineData::cordz_info((InlineData *)this);
  if ((CordzInfo *)local_f0.piece_._M_len != (CordzInfo *)0x0) {
    cord_internal::CordzInfo::Lock((CordzInfo *)local_f0.piece_._M_len,kRemovePrefix);
  }
  this_00 = pCVar6;
  if (((pCVar6->super_CordRep).tag == '\x02') &&
     (RemovePrefix(), this_00 = local_c0, (extraout_RAX & 1) == 0)) {
    LOCK();
    pRVar1 = &(local_c0->super_CordRep).refcount;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + 2;
    UNLOCK();
    cord_internal::CordRep::Unref((CordRep *)pCVar6);
  }
  uVar8 = (this_00->super_CordRep).length;
  sVar9 = uVar8 - n;
  if (uVar8 < n || sVar9 == 0) {
    LOCK();
    pRVar1 = &(this_00->super_CordRep).refcount;
    uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar2 & 1) != 0 || 0 < (int)uVar2) {
      if (uVar2 == 2) {
        cord_internal::CordRep::Destroy(&this_00->super_CordRep);
      }
      pCVar6 = (CordRepBtree *)0x0;
      goto LAB_0029bfbb;
    }
  }
  else {
    uVar4 = (this_00->super_CordRep).tag;
    pCVar6 = this_00;
    if (uVar4 == '\x01') {
      if ((this_00->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2) {
        if ((this_00->super_CordRep).tag != '\x01') {
          __assert_fail("IsSubstring()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x37b,"CordRepSubstring *absl::cord_internal::CordRep::substring()");
        }
        this_00->edges_[0] = (CordRep *)(this_00->edges_[0]->storage + (n - 0xd));
        (this_00->super_CordRep).length = (this_00->super_CordRep).length - n;
        goto LAB_0029bfbb;
      }
    }
    else if (uVar4 == '\x03') {
      pCVar6 = (CordRepBtree *)cord_internal::CordRepBtree::SubTree(this_00,n,sVar9);
      LOCK();
      pRVar1 = &(this_00->super_CordRep).refcount;
      uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + -2;
      UNLOCK();
      if ((uVar2 & 1) == 0 && (int)uVar2 < 1) goto LAB_0029c1d4;
      if (uVar2 == 2) {
        cord_internal::CordRep::Destroy(&this_00->super_CordRep);
      }
      goto LAB_0029bfbb;
    }
    uVar8 = (this_00->super_CordRep).length;
    sVar9 = uVar8 - n;
    if (sVar9 == 0) {
      __assert_fail("n != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x1a4,
                    "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                   );
    }
    if (uVar8 < n || sVar9 == 0) {
      __assert_fail("pos < rep->length",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x1a5,
                    "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                   );
    }
    if (n == 0) {
      LOCK();
      pRVar1 = &(this_00->super_CordRep).refcount;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + 2;
      UNLOCK();
    }
    else {
      pCVar10 = this_00;
      if ((this_00->super_CordRep).tag == '\x01') {
        n = (size_t)(this_00->edges_[0]->storage + (n - 0xd));
        pCVar10 = (CordRepBtree *)this_00->edges_[1];
      }
      pCVar6 = (CordRepBtree *)operator_new(0x20);
      (pCVar6->super_CordRep).length = 0;
      (pCVar6->super_CordRep).refcount = (atomic<int>)0x0;
      (pCVar6->super_CordRep).tag = '\0';
      (pCVar6->super_CordRep).storage[0] = '\0';
      (pCVar6->super_CordRep).storage[1] = '\0';
      (pCVar6->super_CordRep).storage[2] = '\0';
      pCVar6->edges_[0] = (CordRep *)0x0;
      pCVar6->edges_[1] = (CordRep *)0x0;
      (pCVar6->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
      (pCVar6->super_CordRep).length = sVar9;
      (pCVar6->super_CordRep).tag = '\x01';
      pCVar6->edges_[0] = (CordRep *)n;
      if (pCVar10 == (CordRepBtree *)0x0) {
        __assert_fail("rep != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
      }
      LOCK();
      pRVar1 = &(pCVar10->super_CordRep).refcount;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + 2;
      UNLOCK();
      pCVar6->edges_[1] = &pCVar10->super_CordRep;
    }
    LOCK();
    pRVar1 = &(this_00->super_CordRep).refcount;
    uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar2 & 1) != 0 || 0 < (int)uVar2) {
      if (uVar2 == 2) {
        cord_internal::CordRep::Destroy(&this_00->super_CordRep);
      }
LAB_0029bfbb:
      sVar9 = local_f0.piece_._M_len;
      if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
        __assert_fail("data_.is_tree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                      ,0x4fe,
                      "void absl::Cord::InlineRep::SetTreeOrEmpty(absl::Nullable<CordRep *>, const CordzUpdateScope &)"
                     );
      }
      if (pCVar6 == (CordRepBtree *)0x0) {
        (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
        (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
      }
      else {
        (this->contents_).data_.rep_.field_0.as_tree.rep = &pCVar6->super_CordRep;
      }
      if ((CordzInfo *)local_f0.piece_._M_len != (CordzInfo *)0x0) {
        Mutex::AssertHeld((Mutex *)(local_f0.piece_._M_len + 0x38));
        *(CordRepBtree **)(sVar9 + 0x40) = pCVar6;
      }
      cord_internal::CordzUpdateScope::~CordzUpdateScope((CordzUpdateScope *)&local_f0);
      return;
    }
  }
LAB_0029c1d4:
  __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0xac,"bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
}

Assistant:

void Cord::RemovePrefix(size_t n) {
  ABSL_INTERNAL_CHECK(n <= size(),
                      absl::StrCat("Requested prefix size ", n,
                                   " exceeds Cord's size ", size()));
  contents_.MaybeRemoveEmptyCrcNode();
  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    contents_.remove_prefix(n);
  } else {
    auto constexpr method = CordzUpdateTracker::kRemovePrefix;
    CordzUpdateScope scope(contents_.cordz_info(), method);
    tree = cord_internal::RemoveCrcNode(tree);
    if (n >= tree->length) {
      CordRep::Unref(tree);
      tree = nullptr;
    } else if (tree->IsBtree()) {
      CordRep* old = tree;
      tree = tree->btree()->SubTree(n, tree->length - n);
      CordRep::Unref(old);
    } else if (tree->IsSubstring() && tree->refcount.IsOne()) {
      tree->substring()->start += n;
      tree->length -= n;
    } else {
      CordRep* rep = CordRepSubstring::Substring(tree, n, tree->length - n);
      CordRep::Unref(tree);
      tree = rep;
    }
    contents_.SetTreeOrEmpty(tree, scope);
  }
}